

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O0

void __thiscall
binlog::PrettyPrinter::printTime
          (PrettyPrinter *this,OstreamBuffer *out,BrokenDownTime *bdt,int tzoffset,char *tzname)

{
  OstreamBuffer *pOVar1;
  char *pcVar2;
  undefined1 *puVar3;
  long in_RDI;
  char spec;
  char c;
  size_t i;
  undefined7 in_stack_ffffffffffffffa8;
  char in_stack_ffffffffffffffaf;
  OstreamBuffer *in_stack_ffffffffffffffb0;
  undefined6 in_stack_ffffffffffffffc8;
  char cVar4;
  OstreamBuffer *bdt_00;
  OstreamBuffer *this_00;
  
  bdt_00 = (OstreamBuffer *)0x0;
  do {
    this_00 = bdt_00;
    pOVar1 = (OstreamBuffer *)std::__cxx11::string::size();
    if (pOVar1 <= bdt_00) {
      return;
    }
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RDI + 0x20);
    cVar4 = *pcVar2;
    if (cVar4 == '%') {
      in_stack_ffffffffffffffb0 = (OstreamBuffer *)((long)&this_00->_out + 1);
      this_00 = in_stack_ffffffffffffffb0;
      pOVar1 = (OstreamBuffer *)std::__cxx11::string::size();
      if (in_stack_ffffffffffffffb0 == pOVar1) goto LAB_00113c49;
      puVar3 = (undefined1 *)std::__cxx11::string::operator[](in_RDI + 0x20);
      printTimeField((PrettyPrinter *)this_00,
                     (OstreamBuffer *)CONCAT17(cVar4,CONCAT16(*puVar3,in_stack_ffffffffffffffc8)),
                     (char)((ulong)in_RDI >> 0x38),(BrokenDownTime *)bdt_00,
                     (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                     (char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    }
    else {
LAB_00113c49:
      detail::OstreamBuffer::put(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
    }
    bdt_00 = (OstreamBuffer *)((long)&this_00->_out + 1);
  } while( true );
}

Assistant:

void PrettyPrinter::printTime(detail::OstreamBuffer& out, BrokenDownTime& bdt, int tzoffset, const char* tzname) const
{
  for (std::size_t i = 0; i < _timeFormat.size(); ++i)
  {
    const char c = _timeFormat[i];
    if (c == '%' && ++i != _timeFormat.size())
    {
      const char spec = _timeFormat[i];
      printTimeField(out, spec, bdt, tzoffset, tzname);
    }
    else
    {
      out.put(c);
    }
  }
}